

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampParameterTextureBorderColor.cpp
# Opt level: O0

bool __thiscall
glcts::TextureBorderClampParameterTextureBorderColor::verifyGLGetSamplerParameterIivResult
          (TextureBorderClampParameterTextureBorderColor *this,GLuint sampler_id,GLenum target,
          GLint *expected_data)

{
  GLenum GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  ostream *poVar6;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  char *local_500;
  MessageBuilder local_4f8;
  uint local_378;
  uint local_374;
  GLuint j;
  GLuint i;
  Functions *gl;
  stringstream returnedDataStream;
  undefined1 local_358 [376];
  stringstream local_1e0 [8];
  stringstream expectedDataStream;
  undefined1 local_1d0 [399];
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> buffer;
  GLint *expected_data_local;
  GLenum target_local;
  GLuint sampler_id_local;
  TextureBorderClampParameterTextureBorderColor *this_local;
  
  buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = expected_data;
  std::allocator<int>::allocator(&local_41);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,4,&local_41);
  std::allocator<int>::~allocator(&local_41);
  std::__cxx11::stringstream::stringstream(local_1e0);
  std::__cxx11::stringstream::stringstream((stringstream *)&gl);
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TextureBorderClampBase).super_TestCaseBase.m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  _j = CONCAT44(extraout_var,iVar3);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  pvVar5[0] = 0;
  pvVar5[1] = 0;
  pvVar5[2] = 0;
  pvVar5[3] = 0;
  pcVar2 = *(code **)(_j + 0xa38);
  GVar1 = (this->super_TextureBorderClampBase).super_TestCaseBase.m_glExtTokens.TEXTURE_BORDER_COLOR
  ;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  (*pcVar2)(sampler_id,GVar1,pvVar5);
  err = (**(code **)(_j + 0x800))();
  glu::checkError(err,"Error getting  parameter for sampler.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampParameterTextureBorderColor.cpp"
                  ,0x203);
  local_374 = 0;
  do {
    if (3 < local_374) {
      this_local._7_1_ = true;
LAB_0162fecb:
      std::__cxx11::stringstream::~stringstream((stringstream *)&gl);
      std::__cxx11::stringstream::~stringstream(local_1e0);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40)
      ;
      return this_local._7_1_;
    }
    iVar3 = buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage[local_374];
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(ulong)local_374);
    if (iVar3 != *pvVar5) {
      for (local_378 = 0; local_378 < 4; local_378 = local_378 + 1) {
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (local_1d0,
                            buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage[local_378]);
        std::operator<<(poVar6,",");
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_40,(ulong)local_378);
        poVar6 = (ostream *)std::ostream::operator<<(local_358,*pvVar5);
        std::operator<<(poVar6,",");
      }
      this_00 = tcu::TestNode::getTestContext((TestNode *)this);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_4f8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_4f8,
                          (char (*) [107])
                          "Wrong value encountered when calling glGetSamplerParameterIivEXT() with GL_TEXTURE_BORDER_COLOR_EXT pname;"
                         );
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])" texture target:");
      local_500 = TextureBorderClampBase::getTexTargetString
                            (&this->super_TextureBorderClampBase,target);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_500);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b8f97b);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [19])" expected values:[");
      std::__cxx11::stringstream::str();
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_520);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x29dc08e);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])" result values:[");
      std::__cxx11::stringstream::str();
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_540);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2b2eb07);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_520);
      tcu::MessageBuilder::~MessageBuilder(&local_4f8);
      this_local._7_1_ = false;
      goto LAB_0162fecb;
    }
    local_374 = local_374 + 1;
  } while( true );
}

Assistant:

bool TextureBorderClampParameterTextureBorderColor::verifyGLGetSamplerParameterIivResult(
	glw::GLuint sampler_id, glw::GLenum target, const glw::GLint* expected_data)
{
	std::vector<glw::GLint> buffer(m_buffer_length);
	std::stringstream		expectedDataStream;
	std::stringstream		returnedDataStream;
	const glw::Functions&   gl = m_context.getRenderContext().getFunctions();

	memset(&buffer[0], 0, m_buffer_length * sizeof(glw::GLint));

	gl.getSamplerParameterIiv(sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, &buffer[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting  parameter for sampler.");

	for (glw::GLuint i = 0; i < m_buffer_length; ++i)
	{
		if (expected_data[i] != buffer[i])
		{
			for (glw::GLuint j = 0; j < m_buffer_length; ++j)
			{
				expectedDataStream << expected_data[j] << ",";
				returnedDataStream << buffer[j] << ",";
			}
			getTestContext().getLog() << tcu::TestLog::Message
									  << "Wrong value encountered when calling glGetSamplerParameterIivEXT() with "
										 "GL_TEXTURE_BORDER_COLOR_EXT pname;"
									  << " texture target:" << getTexTargetString(target) << "\n"
									  << " expected values:[" << expectedDataStream.str() << "]"
									  << " result values:[" << returnedDataStream.str() << "]\n"
									  << tcu::TestLog::EndMessage;
			return false;
		}
	}
	return true;
}